

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

uint Kit_SopCommonCube(Kit_Sop_t *cSop)

{
  int iVar1;
  bool bVar2;
  undefined4 local_1c;
  undefined4 local_18;
  int i;
  uint uCube;
  uint uMask;
  Kit_Sop_t *cSop_local;
  
  i = -1;
  local_1c = 0;
  while( true ) {
    iVar1 = Kit_SopCubeNum(cSop);
    bVar2 = false;
    if (local_1c < iVar1) {
      local_18 = Kit_SopCube(cSop,local_1c);
      bVar2 = local_18 != 0;
    }
    if (!bVar2) break;
    i = local_18 & i;
    local_1c = local_1c + 1;
  }
  return i;
}

Assistant:

static inline unsigned Kit_SopCommonCube( Kit_Sop_t * cSop )
{
    unsigned uMask, uCube;
    int i;
    uMask = ~(unsigned)0;
    Kit_SopForEachCube( cSop, uCube, i )
        uMask &= uCube;
    return uMask;
}